

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O2

pair<int,_Point>
findClosestIntersection<Sphere>(vector<Sphere,_std::allocator<Sphere>_> *objects,Segment *seg)

{
  pointer pSVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  float fVar4;
  pair<bool,_Point> pVar5;
  pair<int,_Point> pVar6;
  undefined8 local_68;
  undefined1 local_50 [8];
  undefined8 local_48;
  ulong local_40;
  float local_38;
  uint local_34;
  
  local_38 = 3.4028235e+38;
  local_34 = 0xffffffff;
  lVar2 = 0;
  local_68 = 0;
  local_40 = 0;
  for (uVar3 = 0;
      pSVar1 = (objects->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(objects->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pSVar1) / 0x18);
      uVar3 = uVar3 + 1) {
    pVar5 = intersection(seg,(Sphere *)((long)&(pSVar1->center).x + lVar2));
    local_50 = pVar5._0_8_;
    local_48 = pVar5.second._4_8_;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      fVar4 = distance(&seg->a,(Point *)(local_50 + 4));
      if (fVar4 < local_38) {
        local_40 = (ulong)local_50 >> 0x20;
        local_68 = local_48;
        local_34 = (uint)uVar3;
        local_38 = fVar4;
      }
    }
    lVar2 = lVar2 + 0x18;
  }
  pVar6._0_8_ = (ulong)local_34 | local_40 << 0x20;
  pVar6.second.y = (float)(undefined4)local_68;
  pVar6.second.z = (float)local_68._4_4_;
  return pVar6;
}

Assistant:

std::pair<int, Point> findClosestIntersection(std::vector<T> const& objects, Segment const& seg)
{
  Point closestPoint{};
  int sphereIndex = -1;
  float closestDistance = std::numeric_limits<float>::max();

  for (size_t i = 0; i < objects.size(); i++)
  {
    auto const& res = intersection(seg, objects[i]);
    if (!res.first)
      continue;

    float dist = distance(seg.a, res.second);
    if (dist < closestDistance)
    {
      closestDistance = dist;
      closestPoint = res.second;
      sphereIndex = i;
    }
  }
  return {sphereIndex, closestPoint};
}